

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall cmGeneratorTarget::ComputeCompileFeatures(cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  string *psVar2;
  ulong uVar3;
  mapped_type *__lhs;
  BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *languageStandardProperty;
  undefined1 local_158 [8];
  string newRequiredStandard;
  cmValue currentLanguageStandard;
  string local_100;
  cmAlphaNum local_e0;
  undefined1 local_b0 [8];
  string key;
  undefined1 local_80 [8];
  string lang;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *f;
  iterator __end1;
  iterator __begin1;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  features;
  cmStandardLevelResolver standardResolver;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  cmStandardLevelResolver::cmStandardLevelResolver
            ((cmStandardLevelResolver *)
             &features.
              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,this->Makefile);
  GetCompileFeatures((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&__range1,this,config);
  __end1 = std::
           vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&__range1);
  f = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
      std::
      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::end((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&__range1);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     *)&f), bVar1) {
    lang.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ::operator*(&__end1);
    std::__cxx11::string::string((string *)local_80);
    psVar2 = cmTarget::GetName_abi_cxx11_(this->Target);
    bVar1 = cmStandardLevelResolver::CompileFeatureKnown
                      ((cmStandardLevelResolver *)
                       &features.
                        super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,psVar2,
                       (string *)lang.field_2._8_8_,(string *)local_80,(string *)0x0);
    if (bVar1) {
      cmsys::SystemTools::UpperCase(&local_100,config);
      cmAlphaNum::cmAlphaNum(&local_e0,&local_100);
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)&currentLanguageStandard,'-');
      cmStrCat<std::__cxx11::string>
                ((string *)local_b0,&local_e0,(cmAlphaNum *)&currentLanguageStandard,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
      std::__cxx11::string::~string((string *)&local_100);
      newRequiredStandard.field_2._8_8_ = GetLanguageStandard(this,(string *)local_80,config);
      std::__cxx11::string::string((string *)local_158);
      psVar2 = cmTarget::GetName_abi_cxx11_(this->Target);
      bVar1 = cmStandardLevelResolver::GetNewRequiredStandard
                        ((cmStandardLevelResolver *)
                         &features.
                          super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,psVar2,
                         (string *)lang.field_2._8_8_,(cmValue)newRequiredStandard.field_2._8_8_,
                         (string *)local_158,(string *)0x0);
      if (bVar1) {
        uVar3 = std::__cxx11::string::empty();
        if ((uVar3 & 1) == 0) {
          __lhs = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ::operator[](&this->LanguageStandardMap,(key_type *)local_b0);
          bVar1 = std::operator!=(&__lhs->Value,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_158);
          if (bVar1) {
            std::__cxx11::string::operator=((string *)__lhs,(string *)local_158);
            std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
                      (&__lhs->Backtraces);
          }
          std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>::
          emplace_back<cmListFileBacktrace_const&>
                    ((vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>> *)
                     &__lhs->Backtraces,(cmListFileBacktrace *)(lang.field_2._8_8_ + 0x20));
        }
        key.field_2._8_4_ = 0;
      }
      else {
        this_local._7_1_ = 0;
        key.field_2._8_4_ = 1;
      }
      std::__cxx11::string::~string((string *)local_158);
      std::__cxx11::string::~string((string *)local_b0);
    }
    else {
      this_local._7_1_ = 0;
      key.field_2._8_4_ = 1;
    }
    std::__cxx11::string::~string((string *)local_80);
    if (key.field_2._8_4_ != 0) goto LAB_0074a5c6;
    __gnu_cxx::
    __normal_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++(&__end1);
  }
  this_local._7_1_ = 1;
  key.field_2._8_4_ = 1;
LAB_0074a5c6:
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&__range1);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmGeneratorTarget::ComputeCompileFeatures(std::string const& config) const
{
  // Compute the language standard based on the compile features.
  cmStandardLevelResolver standardResolver(this->Makefile);
  std::vector<BT<std::string>> features = this->GetCompileFeatures(config);
  for (BT<std::string> const& f : features) {
    std::string lang;
    if (!standardResolver.CompileFeatureKnown(this->Target->GetName(), f.Value,
                                              lang, nullptr)) {
      return false;
    }

    std::string key = cmStrCat(cmSystemTools::UpperCase(config), '-', lang);
    cmValue currentLanguageStandard = this->GetLanguageStandard(lang, config);

    std::string newRequiredStandard;
    if (!standardResolver.GetNewRequiredStandard(
          this->Target->GetName(), f.Value, currentLanguageStandard,
          newRequiredStandard)) {
      return false;
    }

    if (!newRequiredStandard.empty()) {
      BTs<std::string>& languageStandardProperty =
        this->LanguageStandardMap[key];
      if (languageStandardProperty.Value != newRequiredStandard) {
        languageStandardProperty.Value = newRequiredStandard;
        languageStandardProperty.Backtraces.clear();
      }
      languageStandardProperty.Backtraces.emplace_back(f.Backtrace);
    }
  }

  return true;
}